

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_att.cc
# Opt level: O0

X509_ATTRIBUTE *
X509_ATTRIBUTE_create_by_txt(X509_ATTRIBUTE **attr,char *atrname,int type,uchar *bytes,int len)

{
  ASN1_OBJECT *obj_00;
  X509_ATTRIBUTE *nattr;
  ASN1_OBJECT *obj;
  int len_local;
  uchar *bytes_local;
  int type_local;
  char *attrname_local;
  X509_ATTRIBUTE **attr_local;
  
  obj_00 = OBJ_txt2obj(atrname,0);
  if (obj_00 == (ASN1_OBJECT *)0x0) {
    ERR_put_error(0xb,0,0x6f,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_att.cc"
                  ,0x4e);
    ERR_add_error_data(2,"name=",atrname);
    attr_local = (X509_ATTRIBUTE **)0x0;
  }
  else {
    attr_local = (X509_ATTRIBUTE **)X509_ATTRIBUTE_create_by_OBJ(attr,obj_00,type,bytes,len);
    ASN1_OBJECT_free(obj_00);
  }
  return (X509_ATTRIBUTE *)attr_local;
}

Assistant:

X509_ATTRIBUTE *X509_ATTRIBUTE_create_by_txt(X509_ATTRIBUTE **attr,
                                             const char *attrname, int type,
                                             const unsigned char *bytes,
                                             int len) {
  ASN1_OBJECT *obj;
  X509_ATTRIBUTE *nattr;

  obj = OBJ_txt2obj(attrname, 0);
  if (obj == NULL) {
    OPENSSL_PUT_ERROR(X509, X509_R_INVALID_FIELD_NAME);
    ERR_add_error_data(2, "name=", attrname);
    return NULL;
  }
  nattr = X509_ATTRIBUTE_create_by_OBJ(attr, obj, type, bytes, len);
  ASN1_OBJECT_free(obj);
  return nattr;
}